

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstr.cpp
# Opt level: O0

vm_obj_id_t CVmObjString::create(int in_root_set,wchar_t *str,size_t charlen)

{
  vm_obj_id_t vVar1;
  CVmObject *this;
  ulong in_RDX;
  wchar_t *in_RSI;
  utf8_ptr dst;
  CVmObjString *s;
  vm_obj_id_t id;
  wchar_t *src;
  size_t bytelen;
  size_t i;
  undefined4 in_stack_ffffffffffffffb8;
  wchar_t in_stack_ffffffffffffffbc;
  CVmObjString *in_stack_ffffffffffffffc0;
  wchar_t *local_30;
  ulong local_20;
  
  local_30 = in_RSI;
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
    utf8_ptr::s_wchar_size(*local_30);
    local_30 = local_30 + 1;
  }
  vVar1 = vm_new_id((int)((ulong)in_stack_ffffffffffffffc0 >> 0x20),(int)in_stack_ffffffffffffffc0,
                    in_stack_ffffffffffffffbc);
  CVmObject::operator_new((size_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  CVmObjString(in_stack_ffffffffffffffc0,
               CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  this = vm_objp(0);
  cons_get_buf((CVmObjString *)this);
  utf8_ptr::utf8_ptr((utf8_ptr *)this,
                     (char *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  for (local_20 = 0; local_20 < in_RDX; local_20 = local_20 + 1) {
    utf8_ptr::setch((utf8_ptr *)this,in_stack_ffffffffffffffbc);
  }
  return vVar1;
}

Assistant:

vm_obj_id_t CVmObjString::create(VMG_ int in_root_set,
                                 const wchar_t *str, size_t charlen)
{
    /* get the utf8 byte length of the string */
    size_t i, bytelen;
    const wchar_t *src;
    for (src = str, i = 0, bytelen = 0 ; i < charlen ; ++src, ++i)
        bytelen += utf8_ptr::s_wchar_size(*src);

    /* allocate space */
    vm_obj_id_t id = vm_new_id(vmg_ in_root_set, FALSE, FALSE);
    new (vmg_ id) CVmObjString(vmg_ bytelen);
    CVmObjString *s = (CVmObjString *)vm_objp(vmg_ id);

    /* build the string */
    utf8_ptr dst(s->cons_get_buf());
    for (src = str, i = 0 ; i < charlen ; ++src, ++i)
        dst.setch(*src);

    /* return the new string object ID */
    return id;
}